

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxUnaryNotBoolean::Emit(FxUnaryNotBoolean *this,VMFunctionBuilder *build)

{
  bool bVar1;
  uint uVar2;
  uint opc;
  ExpEmit EVar3;
  FxExpression *pFVar4;
  ExpEmit EVar5;
  ExpEmit from;
  uint extraout_var;
  
  pFVar4 = this->Operand;
  if (pFVar4->ValueType != (PType *)TypeBool) {
    __assert_fail("Operand->ValueType == TypeBool",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x781,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
  }
  if ((this->super_FxExpression).ValueType != pFVar4->ValueType) {
    bVar1 = FxExpression::IsInteger(&this->super_FxExpression);
    if (!bVar1) {
      __assert_fail("ValueType == TypeBool || IsInteger()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x782,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
    }
    pFVar4 = this->Operand;
  }
  EVar3._0_4_ = (*pFVar4->_vptr_FxExpression[9])(pFVar4,build);
  EVar3.Konst = (bool)(char)extraout_var;
  EVar3.Fixed = (bool)(char)(extraout_var >> 8);
  EVar3.Final = (bool)(char)(extraout_var >> 0x10);
  EVar3.Target = (bool)(char)(extraout_var >> 0x18);
  from = EVar3;
  ExpEmit::Free(&from,build);
  uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  if ((extraout_var & 1) == 0) {
    opc = VMFunctionBuilder::GetConstantInt(build,1);
    VMFunctionBuilder::Emit(build,0x7c,uVar2 & 0xffff,EVar3._0_4_ & 0xffff,opc);
    EVar5._0_4_ = uVar2 & 0xffff | 0x1000000;
    EVar5.Konst = false;
    EVar5.Fixed = false;
    EVar5.Final = false;
    EVar5.Target = false;
    return EVar5;
  }
  __assert_fail("!from.Konst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x786,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *build)
{
	assert(Operand->ValueType == TypeBool);
	assert(ValueType == TypeBool || IsInteger());	// this may have been changed by an int cast.
	ExpEmit from = Operand->Emit(build);
	from.Free(build);
	ExpEmit to(build, REGT_INT);
	assert(!from.Konst);
	// boolean not is the same as XOR-ing the lowest bit

	build->Emit(OP_XOR_RK, to.RegNum, from.RegNum, build->GetConstantInt(1));
	return to;
}